

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET mpp_enc_proc_rc_cfg(MppCodingType coding,MppEncRcCfg *dst,MppEncRcCfg *src)

{
  int local_138;
  int local_134;
  uint local_130;
  uint local_12c;
  RK_S32 bps_max;
  RK_S32 bps_min;
  MppEncRcCfg bak;
  RK_U32 change;
  MPP_RET ret;
  MppEncRcCfg *src_local;
  MppEncRcCfg *dst_local;
  MppCodingType coding_local;
  
  bak._228_4_ = 0;
  bak.refresh_length = src->change;
  if (bak.refresh_length != 0) {
    memcpy(&bps_max,dst,0xe8);
    if ((bak.refresh_length & 1U) != 0) {
      dst->rc_mode = src->rc_mode;
    }
    if ((bak.refresh_length & 2U) != 0) {
      dst->quality = src->quality;
    }
    if ((bak.refresh_length & 4U) != 0) {
      dst->bps_target = src->bps_target;
      dst->bps_max = src->bps_max;
      dst->bps_min = src->bps_min;
    }
    if ((bak.refresh_length & 0x20U) != 0) {
      dst->fps_in_flex = src->fps_in_flex;
      dst->fps_in_num = src->fps_in_num;
      dst->fps_in_denom = src->fps_in_denom;
    }
    if ((bak.refresh_length & 0x40U) != 0) {
      dst->fps_out_flex = src->fps_out_flex;
      dst->fps_out_num = src->fps_out_num;
      dst->fps_out_denom = src->fps_out_denom;
      dst->fps_chg_no_idr = src->fps_chg_no_idr;
    }
    if ((bak.refresh_length & 0x80U) != 0) {
      if ((dst->gop < src->gop) && (dst->refresh_en != 0)) {
        dst->refresh_en = 0;
      }
      dst->gop = src->gop;
    }
    if ((bak.refresh_length & 0x10000000U) != 0) {
      dst->ref_cfg = src->ref_cfg;
    }
    if ((bak.refresh_length & 0x200U) != 0) {
      dst->max_reenc_times = src->max_reenc_times;
    }
    if ((bak.refresh_length & 0x400U) != 0) {
      dst->drop_mode = src->drop_mode;
      dst->drop_threshold = src->drop_threshold;
      dst->drop_gap = src->drop_gap;
    }
    if ((bak.refresh_length & 0x4000U) != 0) {
      if (1 < (int)src->rc_priority) {
        _mpp_log_l(2,"mpp_enc","invalid rc_priority %d should be[%d, %d] \n",(char *)0x0,
                   (ulong)src->rc_priority,0,2);
        bak._228_4_ = 0xfffffffa;
      }
      dst->rc_priority = src->rc_priority;
    }
    if ((bak.refresh_length & 0x8000U) != 0) {
      if (2 < (int)src->super_mode) {
        _mpp_log_l(2,"mpp_enc","invalid super_mode %d should be[%d, %d] \n",(char *)0x0,
                   (ulong)src->super_mode,0,3);
        bak._228_4_ = 0xfffffffa;
      }
      dst->super_mode = src->super_mode;
      dst->super_i_thd = src->super_i_thd;
      dst->super_p_thd = src->super_p_thd;
    }
    if ((bak.refresh_length & 0x1000000U) != 0) {
      dst->debreath_en = src->debreath_en;
      dst->debre_strength = src->debre_strength;
      if ((dst->debreath_en != 0) && (0x23 < dst->debre_strength)) {
        _mpp_log_l(2,"mpp_enc","invalid debre_strength should be[%d, %d] \n",(char *)0x0,0,0x23);
        bak._228_4_ = 0xfffffffa;
      }
    }
    if ((bak.refresh_length & 0x800U) != 0) {
      dst->max_i_prop = src->max_i_prop;
    }
    if ((bak.refresh_length & 0x1000U) != 0) {
      dst->min_i_prop = src->min_i_prop;
    }
    if ((bak.refresh_length & 0x2000U) != 0) {
      dst->init_ip_ratio = src->init_ip_ratio;
    }
    if ((bak.refresh_length & 0x10000U) != 0) {
      dst->qp_init = src->qp_init;
    }
    if ((bak.refresh_length & 0x20000U) != 0) {
      dst->qp_min = src->qp_min;
      dst->qp_max = src->qp_max;
    }
    if ((bak.refresh_length & 0x40000U) != 0) {
      dst->qp_min_i = src->qp_min_i;
      dst->qp_max_i = src->qp_max_i;
    }
    if ((bak.refresh_length & 0x80000U) != 0) {
      dst->qp_max_step = src->qp_max_step;
    }
    if ((bak.refresh_length & 0x100000U) != 0) {
      dst->qp_delta_ip = src->qp_delta_ip;
    }
    if ((bak.refresh_length & 0x200000U) != 0) {
      dst->qp_delta_vi = src->qp_delta_vi;
    }
    if ((bak.refresh_length & 0x20000000U) != 0) {
      dst->fqp_min_i = src->fqp_min_i;
      dst->fqp_min_p = src->fqp_min_p;
      dst->fqp_max_i = src->fqp_max_i;
      dst->fqp_max_p = src->fqp_max_p;
    }
    if ((bak.refresh_length & 0x2000000U) != 0) {
      dst->hier_qp_en = src->hier_qp_en;
      *(undefined8 *)dst->hier_qp_delta = *(undefined8 *)src->hier_qp_delta;
      *(undefined8 *)(dst->hier_qp_delta + 2) = *(undefined8 *)(src->hier_qp_delta + 2);
      *(undefined8 *)dst->hier_frame_num = *(undefined8 *)src->hier_frame_num;
      *(undefined8 *)(dst->hier_frame_num + 2) = *(undefined8 *)(src->hier_frame_num + 2);
    }
    if ((bak.refresh_length & 0x4000000U) != 0) {
      dst->stats_time = src->stats_time;
    }
    if ((bak.refresh_length & 0x8000000U) != 0) {
      if (dst->debreath_en != 0) {
        _mpp_log_l(2,"mpp_enc","Turn off Debreath first.","mpp_enc_proc_rc_cfg");
        bak._228_4_ = 0xfffffffa;
      }
      dst->refresh_en = src->refresh_en;
      dst->refresh_mode = src->refresh_mode;
      dst->refresh_num = src->refresh_num;
    }
    if (4 < (int)dst->rc_mode) {
      _mpp_log_l(2,"mpp_enc","invalid rc mode %d should be RC_MODE_VBR or RC_MODE_CBR\n",(char *)0x0
                 ,(ulong)src->rc_mode);
      bak._228_4_ = 0xfffffffa;
    }
    if (6 < (int)dst->quality) {
      _mpp_log_l(2,"mpp_enc","invalid quality %d should be from QUALITY_WORST to QUALITY_BEST\n",
                 (char *)0x0,(ulong)dst->quality);
      bak._228_4_ = 0xfffffffa;
    }
    if (dst->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
      local_12c = 0x400;
      local_130 = 0xc800000;
      if (coding == MPP_VIDEO_CodingMJPEG) {
        local_12c = 0x1000;
        local_130 = 0x32000000;
      }
      if ((((((int)local_130 <= dst->bps_target) || (dst->bps_target <= (int)local_12c)) ||
           ((int)local_130 <= dst->bps_max)) ||
          ((dst->bps_max <= (int)local_12c || ((int)local_130 <= dst->bps_min)))) ||
         (dst->bps_min <= (int)local_12c)) {
        _mpp_log_l(2,"mpp_enc",
                   "invalid bit per second %x:%u min %x:%u max %x:%u out of range %dK~%dM\n",
                   (char *)0x0,(ulong)(uint)dst->bps_target,(ulong)(uint)dst->bps_target,
                   dst->bps_min,dst->bps_min,dst->bps_max,dst->bps_max,local_12c / 0x400,
                   local_130 / 0x100000);
        bak._228_4_ = 0xfffffffa;
      }
    }
    if (((dst->fps_in_num < 0) || (dst->fps_in_denom < 0)) ||
       ((dst->fps_out_num < 0 || (dst->fps_out_denom < 0)))) {
      _mpp_log_l(2,"mpp_enc","invalid fps cfg [number:denom:flex]: in [%d:%d:%d] out [%d:%d:%d]\n",
                 (char *)0x0,(ulong)(uint)dst->fps_in_num,(ulong)(uint)dst->fps_in_denom,
                 dst->fps_in_flex,dst->fps_out_num,dst->fps_out_denom,dst->fps_out_flex);
      bak._228_4_ = 0xfffffffa;
    }
    if (dst->qp_min_i < 1) {
      dst->qp_min_i = dst->qp_min;
    }
    if (dst->qp_max_i < 1) {
      dst->qp_max_i = dst->qp_max;
    }
    if ((((((dst->qp_min < 0) || (dst->qp_max < 0)) || (dst->qp_max < dst->qp_min)) ||
         ((dst->qp_min_i < 0 || (dst->qp_max_i < 0)))) || (dst->qp_max_i < dst->qp_min_i)) ||
       ((0 < dst->qp_init && ((dst->qp_max_i < dst->qp_init || (dst->qp_init < dst->qp_min_i)))))) {
      _mpp_log_l(2,"mpp_enc","invalid qp range: init %d i [%d:%d] p [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->qp_init,(ulong)(uint)dst->qp_min_i,dst->qp_max_i,dst->qp_min,
                 dst->qp_max);
      dst->qp_init = bak.min_i_prop;
      dst->qp_min_i = bak.qp_max_i;
      dst->qp_max_i = bak.qp_init;
      dst->qp_min = bak.qp_max;
      dst->qp_max = bak.init_ip_ratio;
      _mpp_log_l(2,"mpp_enc","restore qp range: init %d i [%d:%d] p [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->qp_init,(ulong)(uint)dst->qp_min_i,dst->qp_max_i,dst->qp_min,
                 dst->qp_max);
    }
    if (dst->qp_delta_ip < 0) {
      local_134 = -dst->qp_delta_ip;
    }
    else {
      local_134 = dst->qp_delta_ip;
    }
    if (8 < local_134) {
      _mpp_log_l(2,"mpp_enc","invalid qp delta ip %d restore to %d\n",(char *)0x0,
                 (ulong)(uint)dst->qp_delta_ip,(ulong)(uint)bak.qp_min_i);
      dst->qp_delta_ip = bak.qp_min_i;
    }
    if (dst->qp_delta_vi < 0) {
      local_138 = -dst->qp_delta_vi;
    }
    else {
      local_138 = dst->qp_delta_vi;
    }
    if (6 < local_138) {
      _mpp_log_l(2,"mpp_enc","invalid qp delta vi %d restore to %d\n",(char *)0x0,
                 (ulong)(uint)dst->qp_delta_vi,(ulong)(uint)bak.qp_max_step);
      dst->qp_delta_vi = bak.qp_max_step;
    }
    if (dst->qp_max_step < 0) {
      _mpp_log_l(2,"mpp_enc","invalid qp max step %d restore to %d\n",(char *)0x0,
                 (ulong)(uint)dst->qp_max_step,(ulong)(uint)bak.qp_min);
      dst->qp_max_step = bak.qp_min;
    }
    if ((dst->stats_time != 0) && (0x3c < dst->stats_time)) {
      _mpp_log_l(2,"mpp_enc","warning: bitrate statistic time %d is larger than 60s\n",(char *)0x0,
                 (ulong)(uint)dst->stats_time);
    }
    dst->change = bak.refresh_length | dst->change;
    if (bak._228_4_ == 0) {
      _mpp_log_l(4,"mpp_enc","MPP_ENC_SET_RC_CFG bps %d [%d : %d] fps [%d:%d] gop %d\n",(char *)0x0,
                 (ulong)(uint)dst->bps_target,(ulong)(uint)dst->bps_min,dst->bps_max,dst->fps_in_num
                 ,dst->fps_out_num,dst->gop);
    }
    else {
      _mpp_log_l(2,"mpp_enc","failed to accept new rc config\n","mpp_enc_proc_rc_cfg");
      memcpy(dst,&bps_max,0xe8);
    }
  }
  return bak._228_4_;
}

Assistant:

MPP_RET mpp_enc_proc_rc_cfg(MppCodingType coding, MppEncRcCfg *dst, MppEncRcCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncRcCfg bak = *dst;

        if (change & MPP_ENC_RC_CFG_CHANGE_RC_MODE)
            dst->rc_mode = src->rc_mode;

        if (change & MPP_ENC_RC_CFG_CHANGE_QUALITY)
            dst->quality = src->quality;

        if (change & MPP_ENC_RC_CFG_CHANGE_BPS) {
            dst->bps_target = src->bps_target;
            dst->bps_max = src->bps_max;
            dst->bps_min = src->bps_min;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_FPS_IN) {
            dst->fps_in_flex = src->fps_in_flex;
            dst->fps_in_num = src->fps_in_num;
            dst->fps_in_denom = src->fps_in_denom;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_FPS_OUT) {
            dst->fps_out_flex = src->fps_out_flex;
            dst->fps_out_num = src->fps_out_num;
            dst->fps_out_denom = src->fps_out_denom;
            dst->fps_chg_no_idr = src->fps_chg_no_idr;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_GOP) {
            /*
             * If GOP is changed smaller, disable Intra-Refresh
             * and User level should reconfig Intra-Refresh
             */
            if (dst->gop < src->gop && dst->refresh_en) {
                dst->refresh_en = 0;
            }
            dst->gop = src->gop;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_GOP_REF_CFG)
            dst->ref_cfg = src->ref_cfg;

        if (change & MPP_ENC_RC_CFG_CHANGE_MAX_REENC)
            dst->max_reenc_times = src->max_reenc_times;

        if (change & MPP_ENC_RC_CFG_CHANGE_DROP_FRM) {
            dst->drop_mode = src->drop_mode;
            dst->drop_threshold = src->drop_threshold;
            dst->drop_gap = src->drop_gap;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_PRIORITY) {
            if (src->rc_priority >= MPP_ENC_RC_PRIORITY_BUTT) {
                mpp_err("invalid rc_priority %d should be[%d, %d] \n",
                        src->rc_priority, MPP_ENC_RC_BY_BITRATE_FIRST, MPP_ENC_RC_PRIORITY_BUTT);
                ret = MPP_ERR_VALUE;
            }
            dst->rc_priority = src->rc_priority;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_SUPER_FRM) {
            if (src->super_mode >= MPP_ENC_RC_SUPER_FRM_BUTT) {
                mpp_err("invalid super_mode %d should be[%d, %d] \n",
                        src->super_mode, MPP_ENC_RC_SUPER_FRM_NONE, MPP_ENC_RC_SUPER_FRM_BUTT);
                ret = MPP_ERR_VALUE;
            }
            dst->super_mode = src->super_mode;
            dst->super_i_thd = src->super_i_thd;
            dst->super_p_thd = src->super_p_thd;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_DEBREATH) {
            dst->debreath_en    = src->debreath_en;
            dst->debre_strength = src->debre_strength;
            if (dst->debreath_en && dst->debre_strength > 35) {
                mpp_err("invalid debre_strength should be[%d, %d] \n", 0, 35);
                ret = MPP_ERR_VALUE;
            }
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_MAX_I_PROP)
            dst->max_i_prop = src->max_i_prop;

        if (change & MPP_ENC_RC_CFG_CHANGE_MIN_I_PROP)
            dst->min_i_prop = src->min_i_prop;

        if (change & MPP_ENC_RC_CFG_CHANGE_INIT_IP_RATIO)
            dst->init_ip_ratio = src->init_ip_ratio;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_INIT)
            dst->qp_init = src->qp_init;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_RANGE) {
            dst->qp_min = src->qp_min;
            dst->qp_max = src->qp_max;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_RANGE_I) {
            dst->qp_min_i = src->qp_min_i;
            dst->qp_max_i = src->qp_max_i;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_MAX_STEP)
            dst->qp_max_step = src->qp_max_step;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_IP)
            dst->qp_delta_ip = src->qp_delta_ip;

        if (change & MPP_ENC_RC_CFG_CHANGE_QP_VI)
            dst->qp_delta_vi = src->qp_delta_vi;

        if (change & MPP_ENC_RC_CFG_CHANGE_FQP) {
            dst->fqp_min_i = src->fqp_min_i;
            dst->fqp_min_p = src->fqp_min_p;
            dst->fqp_max_i = src->fqp_max_i;
            dst->fqp_max_p = src->fqp_max_p;
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_HIER_QP) {
            dst->hier_qp_en = src->hier_qp_en;
            memcpy(dst->hier_qp_delta, src->hier_qp_delta, sizeof(src->hier_qp_delta));
            memcpy(dst->hier_frame_num, src->hier_frame_num, sizeof(src->hier_frame_num));
        }

        if (change & MPP_ENC_RC_CFG_CHANGE_ST_TIME)
            dst->stats_time = src->stats_time;

        if (change & MPP_ENC_RC_CFG_CHANGE_REFRESH) {
            if (dst->debreath_en) {
                mpp_err_f("Turn off Debreath first.");
                ret = MPP_ERR_VALUE;
            }
            dst->refresh_en = src->refresh_en;
            dst->refresh_mode = src->refresh_mode;
            // Make sure refresh_num is legal
            dst->refresh_num = src->refresh_num;
        }

        // parameter checking
        if (dst->rc_mode >= MPP_ENC_RC_MODE_BUTT) {
            mpp_err("invalid rc mode %d should be RC_MODE_VBR or RC_MODE_CBR\n",
                    src->rc_mode);
            ret = MPP_ERR_VALUE;
        }
        if (dst->quality >= MPP_ENC_RC_QUALITY_BUTT) {
            mpp_err("invalid quality %d should be from QUALITY_WORST to QUALITY_BEST\n",
                    dst->quality);
            ret = MPP_ERR_VALUE;
        }

        if (dst->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
            RK_S32 bps_min = MPP_ENC_MIN_BPS;
            RK_S32 bps_max = MPP_ENC_MAX_BPS;

            if (coding == MPP_VIDEO_CodingMJPEG) {
                bps_min *= 4;
                bps_max *= 4;
                if (bps_max < 0)
                    bps_max = INT_MAX;
            }

            if ((dst->bps_target >= bps_max || dst->bps_target <= bps_min) ||
                (dst->bps_max    >= bps_max || dst->bps_max    <= bps_min) ||
                (dst->bps_min    >= bps_max || dst->bps_min    <= bps_min)) {
                mpp_err("invalid bit per second %x:%u min %x:%u max %x:%u out of range %dK~%dM\n",
                        dst->bps_target, dst->bps_target, dst->bps_min,
                        dst->bps_min, dst->bps_max, dst->bps_max,
                        bps_min / SZ_1K,  bps_max / SZ_1M);
                ret = MPP_ERR_VALUE;
            }
        }

        if (dst->fps_in_num < 0 || dst->fps_in_denom < 0 ||
            dst->fps_out_num < 0 || dst->fps_out_denom < 0) {
            mpp_err("invalid fps cfg [number:denom:flex]: in [%d:%d:%d] out [%d:%d:%d]\n",
                    dst->fps_in_num, dst->fps_in_denom, dst->fps_in_flex,
                    dst->fps_out_num, dst->fps_out_denom, dst->fps_out_flex);
            ret = MPP_ERR_VALUE;
        }

        // if I frame min/max is not set use normal case
        if (dst->qp_min_i <= 0)
            dst->qp_min_i = dst->qp_min;
        if (dst->qp_max_i <= 0)
            dst->qp_max_i = dst->qp_max;
        if (dst->qp_min < 0 || dst->qp_max < 0 || dst->qp_min > dst->qp_max ||
            dst->qp_min_i < 0 || dst->qp_max_i < 0 ||
            dst->qp_min_i > dst->qp_max_i ||
            (dst->qp_init > 0 &&
             (dst->qp_init > dst->qp_max_i || dst->qp_init < dst->qp_min_i))) {
            mpp_err("invalid qp range: init %d i [%d:%d] p [%d:%d]\n",
                    dst->qp_init, dst->qp_min_i, dst->qp_max_i,
                    dst->qp_min, dst->qp_max);

            dst->qp_init  = bak.qp_init;
            dst->qp_min_i = bak.qp_min_i;
            dst->qp_max_i = bak.qp_max_i;
            dst->qp_min   = bak.qp_min;
            dst->qp_max   = bak.qp_max;

            mpp_err("restore qp range: init %d i [%d:%d] p [%d:%d]\n",
                    dst->qp_init, dst->qp_min_i, dst->qp_max_i,
                    dst->qp_min, dst->qp_max);
        }
        if (MPP_ABS(dst->qp_delta_ip) > 8) {
            mpp_err("invalid qp delta ip %d restore to %d\n",
                    dst->qp_delta_ip, bak.qp_delta_ip);
            dst->qp_delta_ip = bak.qp_delta_ip;
        }
        if (MPP_ABS(dst->qp_delta_vi) > 6) {
            mpp_err("invalid qp delta vi %d restore to %d\n",
                    dst->qp_delta_vi, bak.qp_delta_vi);
            dst->qp_delta_vi = bak.qp_delta_vi;
        }
        if (dst->qp_max_step < 0) {
            mpp_err("invalid qp max step %d restore to %d\n",
                    dst->qp_max_step, bak.qp_max_step);
            dst->qp_max_step = bak.qp_max_step;
        }
        if (dst->stats_time && dst->stats_time > 60) {
            mpp_err("warning: bitrate statistic time %d is larger than 60s\n",
                    dst->stats_time);
        }

        dst->change |= change;

        if (ret) {
            mpp_err_f("failed to accept new rc config\n");
            *dst = bak;
        } else {
            mpp_log("MPP_ENC_SET_RC_CFG bps %d [%d : %d] fps [%d:%d] gop %d\n",
                    dst->bps_target, dst->bps_min, dst->bps_max,
                    dst->fps_in_num, dst->fps_out_num, dst->gop);
        }
    }

    return ret;
}